

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O2

unsigned_long QUtil::get_next_utf8_codepoint(string *utf8_val,size_t *pos,bool *error)

{
  byte bVar1;
  size_t sVar2;
  ulong uVar3;
  byte *pbVar4;
  byte bVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  
  sVar2 = *pos;
  uVar3 = utf8_val->_M_string_length;
  *pos = sVar2 + 1;
  pbVar4 = (byte *)std::__cxx11::string::at((ulong)utf8_val);
  bVar1 = *pbVar4;
  uVar8 = (ulong)bVar1;
  *error = false;
  if ((char)bVar1 < '\0') {
    bVar5 = 0x80;
    lVar7 = 0;
    for (uVar6 = 0x40; (uVar6 & bVar1) != 0; uVar6 = uVar6 >> 1) {
      bVar5 = bVar5 | (byte)uVar6;
      lVar7 = lVar7 + -1;
    }
    if ((-lVar7 - 6U < 0xfffffffffffffffb) || (uVar3 < *pos - lVar7)) {
LAB_001f5dbf:
      *error = true;
      uVar8 = 0xfffd;
    }
    else {
      uVar8 = (ulong)(~(uint)bVar5 & (uint)bVar1);
      for (; lVar7 != 0; lVar7 = lVar7 + 1) {
        *pos = *pos + 1;
        pbVar4 = (byte *)std::__cxx11::string::at((ulong)utf8_val);
        if ((*pbVar4 & 0xffffffc0) != 0x80) {
          *pos = *pos - 1;
          goto LAB_001f5dbf;
        }
        uVar8 = uVar8 << 6 | (ulong)(*pbVar4 & 0x3f);
      }
      lVar7 = *pos - sVar2;
      if ((lVar7 - 2U < 5) &&
         (uVar8 < *(ulong *)("ZN5QUtil20call_main_from_wmainEiPKPKwSt8functionIFiiPKPKcEEE3$_0" +
                            lVar7 * 8 + 0x31))) {
        *error = true;
      }
    }
  }
  return uVar8;
}

Assistant:

unsigned long
QUtil::get_next_utf8_codepoint(std::string const& utf8_val, size_t& pos, bool& error)
{
    auto o_pos = pos;
    size_t len = utf8_val.length();
    unsigned char ch = static_cast<unsigned char>(utf8_val.at(pos++));
    error = false;
    if (ch < 128) {
        return static_cast<unsigned long>(ch);
    }

    size_t bytes_needed = 0;
    unsigned bit_check = 0x40;
    unsigned char to_clear = 0x80;
    while (ch & bit_check) {
        ++bytes_needed;
        to_clear = static_cast<unsigned char>(to_clear | bit_check);
        bit_check >>= 1;
    }
    if (((bytes_needed > 5) || (bytes_needed < 1)) || ((pos + bytes_needed) > len)) {
        error = true;
        return 0xfffd;
    }

    auto codepoint = static_cast<unsigned long>(ch & ~to_clear);
    while (bytes_needed > 0) {
        --bytes_needed;
        ch = static_cast<unsigned char>(utf8_val.at(pos++));
        if ((ch & 0xc0) != 0x80) {
            --pos;
            error = true;
            return 0xfffd;
        }
        codepoint <<= 6;
        codepoint += (ch & 0x3f);
    }
    unsigned long lower_bound = 0;
    switch (pos - o_pos) {
    case 2:
        lower_bound = 1 << 7;
        break;
    case 3:
        lower_bound = 1 << 11;
        break;
    case 4:
        lower_bound = 1 << 16;
        break;
    case 5:
        lower_bound = 1 << 12;
        break;
    case 6:
        lower_bound = 1 << 26;
        break;
    default:
        lower_bound = 0;
    }

    if (lower_bound > 0 && codepoint < lower_bound) {
        // Too many bytes were used, but return whatever character was encoded.
        error = true;
    }
    return codepoint;
}